

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_example.cpp
# Opt level: O0

int main(void)

{
  allocator<bvh::v2::BBox<float,_3UL>_> *this;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  anon_class_16_2_4c4d9b9a __comp;
  pointer pBVar1;
  size_type sVar2;
  ThreadPool *pTVar3;
  size_type sVar4;
  size_t sVar5;
  unsigned_long *puVar6;
  const_reference pvVar7;
  ostream *poVar8;
  Task *pTVar9;
  bool bVar10;
  undefined4 local_dfc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_d70;
  IgnoreArgs local_cb9;
  anon_class_48_6_803771b5 local_cb8;
  Type local_c88;
  undefined1 local_c84 [8];
  SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> stack;
  Scalar v;
  Scalar u;
  size_t prim_id;
  undefined4 local_b64;
  undefined4 uStack_b60;
  undefined4 local_b5c;
  undefined8 local_b58;
  undefined4 local_b4c;
  undefined4 uStack_b48;
  float local_b44;
  undefined1 local_b40 [8];
  Ray ray;
  allocator<bvh::v2::PrecomputedTri<float>_> local_b01;
  undefined1 local_b00 [8];
  vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
  precomputed_tris;
  pointer local_ae0;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_ad8;
  undefined1 local_ac8 [8];
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> bvh;
  Config config;
  allocator<bvh::v2::Vec<float,_3UL>_> local_a41;
  undefined1 local_a40 [8];
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> centers;
  undefined1 local_a20 [8];
  vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> bboxes;
  ParallelExecutor executor;
  ThreadPool thread_pool;
  Vec<float,_3UL> local_8f4;
  undefined8 local_8e8;
  Vec<float,_3UL> local_8dc;
  undefined8 local_8d0;
  Vec<float,_3UL> local_8c4;
  undefined8 local_8b8;
  Vec<float,_3UL> local_8ac;
  undefined8 local_8a0;
  Vec<float,_3UL> local_898 [2];
  undefined8 local_880;
  Vec<float,_3UL> local_874;
  undefined1 local_868 [8];
  vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> tris;
  undefined1 local_778 [16];
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *local_768;
  size_t local_760;
  unsigned_long local_758;
  Task local_748;
  _Manager_type local_728;
  unsigned_long local_720;
  size_t next;
  size_t i;
  unsigned_long local_708;
  _Manager_type local_700;
  unsigned_long chunk_size;
  ThreadPool *local_6f0;
  size_t local_6e8;
  pointer *local_6e0;
  Config local_6c8;
  Config local_6b8;
  pointer local_678;
  pointer pVStack_670;
  pointer local_668;
  pointer pBStack_660;
  undefined1 local_651;
  pointer local_650;
  pointer local_648;
  pointer local_640;
  pointer local_638;
  Config *local_630;
  ThreadPool *local_628;
  pointer local_620;
  pointer pVStack_618;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_610;
  undefined1 *local_600;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *bvh_1;
  anon_class_40_3_92fce145_conflict2 local_5e8;
  Task local_5b8;
  _Manager_type local_598;
  unsigned_long local_590;
  size_t next_1;
  size_t i_1;
  unsigned_long local_578;
  _Manager_type local_570;
  unsigned_long chunk_size_1;
  ThreadPool *local_560;
  size_t local_558;
  pointer *local_550;
  undefined4 local_548;
  undefined4 local_544;
  undefined4 *local_540;
  undefined4 *local_538;
  undefined1 *local_530;
  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  *local_528;
  Config local_510;
  pointer local_500;
  pointer local_4f8;
  pointer local_4f0;
  pointer local_4e8;
  undefined1 local_4d9;
  pointer local_4d8;
  pointer local_4d0;
  pointer local_4c8;
  pointer local_4c0;
  Config *local_4b8;
  pointer local_4b0;
  pointer local_4a8;
  pointer local_4a0;
  pointer local_498;
  undefined1 *local_490;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *bvh_2;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  local_478;
  undefined1 local_460 [8];
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  mini_trees;
  undefined1 local_428 [8];
  MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> builder;
  undefined1 auStack_3b8 [8];
  Config mini_tree_config;
  BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> local_340;
  Config *local_2f8;
  pointer local_2f0;
  pointer local_2e8;
  pointer local_2e0;
  pointer local_2d8;
  undefined1 *local_2d0;
  pointer local_2b8;
  pointer local_2b0;
  pointer local_2a8;
  pointer local_2a0;
  SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> local_298;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1e0;
  pointer local_1c8;
  pointer local_1c0;
  undefined1 *local_1b8;
  unsigned_long *local_1b0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1a8;
  allocator<unsigned_long> local_189;
  pointer local_188;
  pointer local_180;
  pointer local_178;
  pointer local_170;
  Config *local_168;
  BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> *local_160;
  pointer local_158;
  pointer local_150;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_148;
  Config *local_138;
  BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> *local_130;
  span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> local_128;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_118;
  span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> *local_108;
  size_t *local_100;
  unsigned_long *local_f8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_f0;
  unsigned_long *local_e8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_e0;
  size_t local_d8;
  size_t axis;
  pointer local_c0;
  pointer local_b8;
  pointer local_b0;
  pointer local_a8;
  Config *local_a0;
  SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_98;
  span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> local_90;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_80;
  Config *local_70;
  SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_68;
  span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> local_60;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_50;
  Config *local_40;
  ThreadPool *local_38;
  ParallelExecutor *local_30;
  span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> local_28;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_18;
  
  tris.super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::vector
            ((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *)
             local_868);
  local_880 = 0x3ff0000000000000;
  local_874.values[0] = 1.0;
  local_874.values[1] = -1.0;
  local_874.values[2] = 1.0;
  local_8a0 = 0x3ff0000000000000;
  local_898[0].values[0] = 1.0;
  local_898[0].values[1] = 1.0;
  local_898[0].values[2] = 1.0;
  local_8b8 = 0x3ff0000000000000;
  local_8ac.values[0] = -1.0;
  local_8ac.values[1] = 1.0;
  local_8ac.values[2] = 1.0;
  std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>::
  emplace_back<bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>>
            ((vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *)local_868,
             &local_874,local_898,&local_8ac);
  local_8d0 = 0x3ff0000000000000;
  local_8c4.values[0] = 1.0;
  local_8c4.values[1] = -1.0;
  local_8c4.values[2] = 1.0;
  local_8e8 = 0x3ff0000000000000;
  local_8dc.values[0] = -1.0;
  local_8dc.values[1] = -1.0;
  local_8dc.values[2] = 1.0;
  local_8f4.values[0] = -1.0;
  local_8f4.values[1] = 1.0;
  local_8f4.values[2] = 1.0;
  std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>::
  emplace_back<bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>>
            ((vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *)local_868,
             &local_8c4,&local_8dc,&local_8f4);
  ::bvh::v2::ThreadPool::ThreadPool((ThreadPool *)&executor.parallel_threshold,0);
  ::bvh::v2::ParallelExecutor::ParallelExecutor
            ((ParallelExecutor *)
             &bboxes.
              super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (ThreadPool *)&executor.parallel_threshold,0x400);
  sVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::size
                    ((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *
                     )local_868);
  this = (allocator<bvh::v2::BBox<float,_3UL>_> *)
         ((long)&centers.
                 super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<bvh::v2::BBox<float,_3UL>_>::allocator(this);
  std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::vector
            ((vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> *)
             local_a20,sVar2,this);
  std::allocator<bvh::v2::BBox<float,_3UL>_>::~allocator
            ((allocator<bvh::v2::BBox<float,_3UL>_> *)
             ((long)&centers.
                     super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::size
                    ((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *
                     )local_868);
  std::allocator<bvh::v2::Vec<float,_3UL>_>::allocator(&local_a41);
  std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::vector
            ((vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *)
             local_a40,sVar2,&local_a41);
  std::allocator<bvh::v2::Vec<float,_3UL>_>::~allocator(&local_a41);
  pTVar3 = (ThreadPool *)
           std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::size
                     ((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                       *)local_868);
  config.parallel_threshold = (size_t)local_a20;
  local_6e0 = &bboxes.
               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_6e8 = 0;
  chunk_size = (unsigned_long)&config.parallel_threshold;
  local_6f0 = pTVar3;
  if (pTVar3 < executor.thread_pool) {
    main::anon_class_24_3_9fa53d14::operator()
              ((anon_class_24_3_9fa53d14 *)chunk_size,0,(size_t)pTVar3);
  }
  else {
    local_708 = 1;
    sVar5 = ::bvh::v2::ThreadPool::get_thread_count
                      ((ThreadPool *)
                       bboxes.
                       super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    i = (ulong)pTVar3 / sVar5;
    pTVar9 = (Task *)&i;
    puVar6 = std::max<unsigned_long>(&local_708,(unsigned_long *)pTVar9);
    local_700 = (_Manager_type)*puVar6;
    for (next = local_6e8; next < local_6f0; next = (size_t)(local_700 + next)) {
      local_728 = local_700 + next;
      puVar6 = std::min<unsigned_long>((unsigned_long *)&local_6f0,(unsigned_long *)&local_728);
      pBVar1 = bboxes.
               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_758 = *puVar6;
      local_768 = *(vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> **)
                   (chunk_size + 0x10);
      local_778 = *(undefined1 (*) [16])chunk_size;
      local_760 = next;
      local_720 = local_758;
      std::function<void(unsigned_long)>::
      function<bvh::v2::ParallelExecutor::for_each<main::__0>(unsigned_long,unsigned_long,main::__0_const&)::_lambda(unsigned_long)_1_,void>
                ((function<void(unsigned_long)> *)&local_748,(anon_class_40_3_92fce145 *)local_778);
      pTVar9 = &local_748;
      ::bvh::v2::ThreadPool::push((ThreadPool *)pBVar1,pTVar9);
      std::function<void_(unsigned_long)>::~function(&local_748);
    }
    ::bvh::v2::ThreadPool::wait
              ((ThreadPool *)
               bboxes.
               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,pTVar9);
  }
  ::bvh::v2::DefaultBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Config::Config
            ((Config *)
             &bvh.prim_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  config.super_Config.max_leaf_size._0_4_ = 2;
  std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::
  span<std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>_&>
            (&local_ad8,
             (vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> *)
             local_a20);
  std::span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL>::
  span<std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>_&>
            ((span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> *)
             &precomputed_tris.
              super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *)
             local_a40);
  local_600 = local_ac8;
  local_610._M_ptr = local_ad8._M_ptr;
  local_610._M_extent._M_extent_value = local_ad8._M_extent._M_extent_value;
  local_620 = precomputed_tris.
              super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pVStack_618 = local_ae0;
  local_628 = (ThreadPool *)&executor.parallel_threshold;
  local_630 = (Config *)
              &bvh.prim_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_610);
  pTVar3 = local_628;
  if (sVar2 < local_630[1].sah.prim_offset_) {
    local_640 = local_610._M_ptr;
    local_638 = (pointer)local_610._M_extent._M_extent_value;
    local_650 = local_620;
    local_648 = pVStack_618;
    local_490 = local_ac8;
    local_4a0 = local_610._M_ptr;
    local_498 = (pointer)local_610._M_extent._M_extent_value;
    local_4b0 = local_620;
    local_4a8 = pVStack_618;
    local_4b8 = local_630;
    if ((int)local_630[1].sah.log_cluster_size_ == 0) {
      local_4c8 = local_610._M_ptr;
      local_4c0 = (pointer)local_610._M_extent._M_extent_value;
      local_4d8 = local_620;
      local_4d0 = pVStack_618;
      local_2d0 = local_ac8;
      local_2e0 = local_610._M_ptr;
      local_2d8 = (pointer)local_610._M_extent._M_extent_value;
      local_2f0 = local_620;
      local_2e8 = pVStack_618;
      local_2f8 = local_630;
      local_148._M_ptr = local_610._M_ptr;
      local_148._M_extent._M_extent_value = local_610._M_extent._M_extent_value;
      local_158 = local_620;
      local_150 = pVStack_618;
      local_160 = &local_340;
      local_168 = local_630;
      local_178 = local_610._M_ptr;
      local_170 = (pointer)local_610._M_extent._M_extent_value;
      local_188 = local_620;
      local_180 = pVStack_618;
      local_118._M_ptr = local_610._M_ptr;
      local_118._M_extent._M_extent_value = local_610._M_extent._M_extent_value;
      local_128._M_ptr = &local_620->p0;
      local_128._M_extent._M_extent_value = (size_t)pVStack_618;
      local_138 = local_630;
      local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.
      _vptr_TopDownSahBuilder = (_func_int **)&PTR___cxa_pure_virtual_0015bce8;
      local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.bboxes_._M_ptr =
           local_610._M_ptr;
      local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.bboxes_._M_extent.
      _M_extent_value = local_610._M_extent._M_extent_value;
      local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.centers_._M_ptr =
           &local_620->p0;
      local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.centers_._M_extent.
      _M_extent_value = (size_t)pVStack_618;
      local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.config_ = local_630;
      local_130 = local_160;
      sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_118);
      sVar4 = std::span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL>::size(&local_128);
      if (sVar2 != sVar4) {
        __assert_fail("bboxes.size() == centers.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                      ,0x3f,
                      "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                     );
      }
      if (local_138->max_leaf_size < local_138->min_leaf_size) {
        __assert_fail("config.min_leaf_size <= config.max_leaf_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                      ,0x40,
                      "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                     );
      }
      local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.
      _vptr_TopDownSahBuilder = (_func_int **)&PTR_get_prim_ids_0015bca0;
      sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_148);
      std::allocator<unsigned_long>::allocator(&local_189);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_340.prim_ids_,sVar2,&local_189);
      std::allocator<unsigned_long>::~allocator(&local_189);
      local_1a8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&local_340.prim_ids_);
      local_1b0 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            (&local_340.prim_ids_);
      std::
      iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                (local_1a8,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_1b0,0);
      ::bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
                ((Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)local_ac8,
                 &local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>);
      ::bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::~BinnedSahBuilder
                (&local_340);
    }
    else {
      local_4d9 = 0;
      local_4f0 = local_610._M_ptr;
      local_4e8 = (pointer)local_610._M_extent._M_extent_value;
      local_500 = local_620;
      local_4f8 = pVStack_618;
      local_1b8 = local_ac8;
      local_1c8 = local_610._M_ptr;
      local_1c0 = (pointer)local_610._M_extent._M_extent_value;
      local_1e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_620;
      local_1e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pVStack_618;
      local_1e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_630;
      local_2a8 = local_610._M_ptr;
      local_2a0 = (pointer)local_610._M_extent._M_extent_value;
      local_2b8 = local_620;
      local_2b0 = pVStack_618;
      local_80._M_ptr = local_610._M_ptr;
      local_80._M_extent._M_extent_value = local_610._M_extent._M_extent_value;
      local_90._M_ptr = &local_620->p0;
      local_90._M_extent._M_extent_value = (size_t)pVStack_618;
      local_98 = &local_298;
      local_a0 = local_630;
      local_b0 = local_610._M_ptr;
      local_a8 = (pointer)local_610._M_extent._M_extent_value;
      local_c0 = local_620;
      local_b8 = pVStack_618;
      local_50._M_ptr = local_610._M_ptr;
      local_50._M_extent._M_extent_value = local_610._M_extent._M_extent_value;
      local_60._M_ptr = &local_620->p0;
      local_60._M_extent._M_extent_value = (size_t)pVStack_618;
      local_70 = local_630;
      local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.
      _vptr_TopDownSahBuilder = (_func_int **)&PTR___cxa_pure_virtual_0015bce8;
      local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.bboxes_._M_ptr =
           local_610._M_ptr;
      local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.bboxes_._M_extent.
      _M_extent_value = local_610._M_extent._M_extent_value;
      local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.centers_._M_ptr =
           &local_620->p0;
      local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.centers_._M_extent.
      _M_extent_value = (size_t)pVStack_618;
      local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.config_ = local_630;
      local_68 = local_98;
      sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_50);
      sVar4 = std::span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL>::size(&local_60);
      if (sVar2 != sVar4) {
        __assert_fail("bboxes.size() == centers.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                      ,0x3f,
                      "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                     );
      }
      if (local_70->max_leaf_size < local_70->min_leaf_size) {
        __assert_fail("config.min_leaf_size <= config.max_leaf_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                      ,0x40,
                      "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                     );
      }
      local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.
      _vptr_TopDownSahBuilder = (_func_int **)&PTR_get_prim_ids_0015bd08;
      std::vector<bool,_std::allocator<bool>_>::vector(&local_298.marks_);
      std::vector<float,_std::allocator<float>_>::vector(&local_298.accum_);
      local_d70 = local_298.prim_ids_;
      do {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_d70);
        local_d70 = local_d70 + 1;
      } while (local_d70 != &local_1e0);
      sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_80);
      std::vector<bool,_std::allocator<bool>_>::resize(&local_298.marks_,sVar2,false);
      sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_80);
      std::vector<float,_std::allocator<float>_>::resize(&local_298.accum_,sVar2);
      for (local_d8 = 0; local_d8 < 3; local_d8 = local_d8 + 1) {
        this_00 = local_298.prim_ids_ + local_d8;
        sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_80);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,sVar2);
        local_e0._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (local_298.prim_ids_ + local_d8);
        local_e8 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             (local_298.prim_ids_ + local_d8);
        std::
        iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                  (local_e0,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )local_e8,0);
        local_f0._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (local_298.prim_ids_ + local_d8);
        local_f8 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             (local_298.prim_ids_ + local_d8);
        local_108 = &local_90;
        local_100 = &local_d8;
        __comp.axis = local_100;
        __comp.centers = local_108;
        std::
        sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::SweepSahBuilder(std::span<bvh::v2::BBox<float,3ul>const,18446744073709551615ul>,std::span<bvh::v2::Vec<float,3ul>const,18446744073709551615ul>,bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long,unsigned_long)_1_>
                  (local_f0,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )local_f8,__comp);
      }
      ::bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
                ((Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)local_ac8,
                 &local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>);
      ::bvh::v2::SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::~SweepSahBuilder
                (&local_298);
      if ((int)local_4b8[1].sah.log_cluster_size_ == 2) {
        local_510.batch_size_ratio = 0.05;
        local_510.max_iter_count = 3;
        ::bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::optimize
                  ((Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)local_ac8,&local_510);
      }
      local_4d9 = 1;
    }
  }
  else {
    local_651 = 0;
    local_668 = local_610._M_ptr;
    pBStack_660 = (pointer)local_610._M_extent._M_extent_value;
    local_678 = local_620;
    pVStack_670 = pVStack_618;
    mini_tree_config.log2_grid_dim = (size_t)local_630;
    ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::Config::Config
              ((Config *)auStack_3b8);
    mini_tree_config.super_Config.min_leaf_size = *(size_t *)(mini_tree_config.log2_grid_dim + 0x20)
    ;
    auStack_3b8 = *(undefined1 (*) [8])mini_tree_config.log2_grid_dim;
    mini_tree_config.super_Config.sah.log_cluster_size_ =
         *(size_t *)(mini_tree_config.log2_grid_dim + 8);
    mini_tree_config.super_Config.sah.prim_offset_ =
         *(size_t *)(mini_tree_config.log2_grid_dim + 0x10);
    mini_tree_config.super_Config.sah._16_8_ =
         *(undefined8 *)(mini_tree_config.log2_grid_dim + 0x18);
    mini_tree_config.super_Config.max_leaf_size._0_1_ =
         -(*(int *)(mini_tree_config.log2_grid_dim + 0x28) != 0) & 1;
    local_dfc = 0x3c23d70a;
    if (*(int *)(mini_tree_config.log2_grid_dim + 0x28) != 2) {
      local_dfc = 0x3dcccccd;
    }
    mini_tree_config.super_Config.max_leaf_size._4_4_ = local_dfc;
    mini_tree_config._40_8_ = *(undefined8 *)(mini_tree_config.log2_grid_dim + 0x30);
    memcpy(&local_6b8,auStack_3b8,0x40);
    builder.config_ = &local_6b8;
    mini_trees.
    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_678;
    local_18._M_ptr = local_668;
    local_18._M_extent._M_extent_value = (size_t)pBStack_660;
    local_28._M_ptr = &local_678->p0;
    local_28._M_extent._M_extent_value = (size_t)pVStack_670;
    local_30 = (ParallelExecutor *)local_428;
    local_38 = pTVar3;
    local_40 = builder.config_;
    ::bvh::v2::ParallelExecutor::ParallelExecutor(local_30,pTVar3,0x400);
    builder.executor_.parallel_threshold = (size_t)local_18._M_ptr;
    builder.bboxes_._M_ptr = (pointer)local_18._M_extent._M_extent_value;
    builder.bboxes_._M_extent._M_extent_value = (size_t)local_28._M_ptr;
    builder.centers_._M_ptr = (pointer)local_28._M_extent._M_extent_value;
    builder.centers_._M_extent._M_extent_value = (size_t)local_40;
    sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_18);
    sVar4 = std::span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL>::size(&local_28);
    if (sVar2 != sVar4) {
      __assert_fail("bboxes.size() == centers.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/mini_tree_builder.h"
                    ,0x9d,
                    "bvh::v2::MiniTreeBuilder<bvh::v2::Node<float, 3>>::MiniTreeBuilder(ThreadPool &, std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>, MortonCode = unsigned int]"
                   );
    }
    ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::build_mini_trees
              ((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                *)local_460,
               (MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *)local_428);
    if (((builder.config_)->enable_pruning & 1U) != 0) {
      ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::
      prune_mini_trees(&local_478,
                       (MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *)
                       local_428,
                       (vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                        *)local_460);
      std::
      vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ::operator=((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                   *)local_460,&local_478);
      std::
      vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ::~vector(&local_478);
    }
    ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::build_top_bvh
              ((Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)local_ac8,
               (MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *)local_428,
               (vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                *)local_460);
    std::
    vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
    ::~vector((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
               *)local_460);
    if ((int)local_630[1].sah.log_cluster_size_ == 2) {
      local_6c8.batch_size_ratio = 0.05;
      local_6c8.max_iter_count = 3;
      ::bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::optimize
                (local_628,(Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)local_ac8,&local_6c8);
    }
    local_651 = 1;
  }
  sVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::size
                    ((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *
                     )local_868);
  std::allocator<bvh::v2::PrecomputedTri<float>_>::allocator(&local_b01);
  std::vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>::
  vector((vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_> *
         )local_b00,sVar2,&local_b01);
  std::allocator<bvh::v2::PrecomputedTri<float>_>::~allocator(&local_b01);
  pTVar3 = (ThreadPool *)
           std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::size
                     ((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                       *)local_868);
  ray._24_8_ = local_ac8;
  local_550 = &bboxes.
               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_558 = 0;
  chunk_size_1 = (unsigned_long)&ray.tmin;
  local_560 = pTVar3;
  if (pTVar3 < executor.thread_pool) {
    main::anon_class_24_3_dbdafb4e::operator()
              ((anon_class_24_3_dbdafb4e *)chunk_size_1,0,(size_t)pTVar3);
  }
  else {
    local_578 = 1;
    sVar5 = ::bvh::v2::ThreadPool::get_thread_count
                      ((ThreadPool *)
                       bboxes.
                       super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    i_1 = (ulong)pTVar3 / sVar5;
    pTVar9 = (Task *)&i_1;
    puVar6 = std::max<unsigned_long>(&local_578,(unsigned_long *)pTVar9);
    local_570 = (_Manager_type)*puVar6;
    for (next_1 = local_558; next_1 < local_560; next_1 = (size_t)(local_570 + next_1)) {
      local_598 = local_570 + next_1;
      puVar6 = std::min<unsigned_long>((unsigned_long *)&local_560,(unsigned_long *)&local_598);
      pBVar1 = bboxes.
               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_5e8.next = *puVar6;
      local_5e8.loop.tris =
           *(vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> **)
            (chunk_size_1 + 0x10);
      local_5e8.loop.bvh = *(Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> **)chunk_size_1;
      local_5e8.loop.precomputed_tris =
           *(vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
             **)(chunk_size_1 + 8);
      local_5e8.i = next_1;
      local_590 = local_5e8.next;
      std::function<void(unsigned_long)>::
      function<bvh::v2::ParallelExecutor::for_each<main::__1>(unsigned_long,unsigned_long,main::__1_const&)::_lambda(unsigned_long)_1_,void>
                ((function<void(unsigned_long)> *)&local_5b8,&local_5e8);
      pTVar9 = &local_5b8;
      ::bvh::v2::ThreadPool::push((ThreadPool *)pBVar1,pTVar9);
      std::function<void_(unsigned_long)>::~function(&local_5b8);
    }
    ::bvh::v2::ThreadPool::wait
              ((ThreadPool *)
               bboxes.
               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,pTVar9);
  }
  local_b58 = 0;
  local_b4c = 0;
  uStack_b48 = 0;
  local_b44 = 0.0;
  prim_id = 0x3ff0000000000000;
  local_b64 = 0;
  uStack_b60 = 0;
  local_b5c = 0x3f800000;
  local_530 = local_b40;
  local_538 = &local_b4c;
  local_540 = &local_b64;
  local_544 = 0;
  local_548 = 0x42c80000;
  local_b40._0_4_ = 0.0;
  local_b40._4_4_ = 0.0;
  ray.org.values[1] = 0.0;
  ray.org.values[2] = 0.0;
  ray.dir.values[1] = 0.0;
  ray.dir.values[2] = 100.0;
  _v = 0xffffffffffffffff;
  ray.org.values[0] = local_b44;
  ::bvh::v2::SmallStack<bvh::v2::Index<32UL,_4UL>,_64U>::SmallStack
            ((SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> *)local_c84);
  local_528 = (vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               *)local_ac8;
  pvVar7 = std::
           vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
           ::operator[](local_528,0);
  local_c88 = (pvVar7->index).value;
  local_cb8.bvh = (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)local_ac8;
  local_cb8.precomputed_tris =
       (vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_> *)
       local_b00;
  local_cb8.ray = (Ray *)local_b40;
  local_cb8.prim_id = (size_t *)&v;
  local_cb8.u = (Scalar *)&stack.size;
  local_cb8.v = (Scalar *)(stack.elems + 0x3f);
  ::bvh::v2::Bvh<bvh::v2::Node<float,3ul,32ul,4ul>>::
  intersect<false,false,bvh::v2::SmallStack<bvh::v2::Index<32ul,4ul>,64u>,main::__2,bvh::v2::IgnoreArgs>
            ((Bvh<bvh::v2::Node<float,3ul,32ul,4ul>> *)local_cb8.bvh,local_cb8.ray,(Index)local_c88,
             (SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> *)local_c84,&local_cb8,&local_cb9);
  bVar10 = _v == 0xffffffffffffffff;
  if (bVar10) {
    poVar8 = std::operator<<((ostream *)&std::cout,"No intersection found");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,"Intersection found\n");
    poVar8 = std::operator<<(poVar8,"  primitive: ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,_v);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"  distance: ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,ray.dir.values[2]);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"  barycentric coords.: ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(float)stack.size);
    poVar8 = std::operator<<(poVar8,", ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(float)stack.elems[0x3f].value);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  tris.super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  tris.super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = bVar10;
  std::vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>::
  ~vector((vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
           *)local_b00);
  ::bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::~Bvh
            ((Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)local_ac8);
  std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::~vector
            ((vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *)
             local_a40);
  std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::~vector
            ((vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> *)
             local_a20);
  ::bvh::v2::ThreadPool::~ThreadPool((ThreadPool *)&executor.parallel_threshold);
  std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::~vector
            ((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *)
             local_868);
  return tris.
         super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
    // This is the original data, which may come in some other data type/structure.
    std::vector<Tri> tris;
    tris.emplace_back(
        Vec3( 1.0, -1.0, 1.0),
        Vec3( 1.0,  1.0, 1.0),
        Vec3(-1.0,  1.0, 1.0)
    );
    tris.emplace_back(
        Vec3( 1.0, -1.0, 1.0),
        Vec3(-1.0, -1.0, 1.0),
        Vec3(-1.0,  1.0, 1.0)
    );

    bvh::v2::ThreadPool thread_pool;
    bvh::v2::ParallelExecutor executor(thread_pool);

    // Get triangle centers and bounding boxes (required for BVH builder)
    std::vector<BBox> bboxes(tris.size());
    std::vector<Vec3> centers(tris.size());
    executor.for_each(0, tris.size(), [&] (size_t begin, size_t end) {
        for (size_t i = begin; i < end; ++i) {
            bboxes[i]  = tris[i].get_bbox();
            centers[i] = tris[i].get_center();
        }
    });

    typename bvh::v2::DefaultBuilder<Node>::Config config;
    config.quality = bvh::v2::DefaultBuilder<Node>::Quality::High;
    auto bvh = bvh::v2::DefaultBuilder<Node>::build(thread_pool, bboxes, centers, config);

    // Permuting the primitive data allows to remove indirections during traversal, which makes it faster.
    static constexpr bool should_permute = true;

    // This precomputes some data to speed up traversal further.
    std::vector<PrecomputedTri> precomputed_tris(tris.size());
    executor.for_each(0, tris.size(), [&] (size_t begin, size_t end) {
        for (size_t i = begin; i < end; ++i) {
            auto j = should_permute ? bvh.prim_ids[i] : i;
            precomputed_tris[i] = tris[j];
        }
    });

    auto ray = Ray {
        Vec3(0., 0., 0.), // Ray origin
        Vec3(0., 0., 1.), // Ray direction
        0.,               // Minimum intersection distance
        100.              // Maximum intersection distance
    };

    static constexpr size_t invalid_id = std::numeric_limits<size_t>::max();
    static constexpr size_t stack_size = 64;
    static constexpr bool use_robust_traversal = false;

    auto prim_id = invalid_id;
    Scalar u, v;

    // Traverse the BVH and get the u, v coordinates of the closest intersection.
    bvh::v2::SmallStack<Bvh::Index, stack_size> stack;
    bvh.intersect<false, use_robust_traversal>(ray, bvh.get_root().index, stack,
        [&] (size_t begin, size_t end) {
            for (size_t i = begin; i < end; ++i) {
                size_t j = should_permute ? i : bvh.prim_ids[i];
                if (auto hit = precomputed_tris[j].intersect(ray)) {
                    prim_id = i;
                    std::tie(ray.tmax, u, v) = *hit;
                }
            }
            return prim_id != invalid_id;
        });

    if (prim_id != invalid_id) {
        std::cout
            << "Intersection found\n"
            << "  primitive: " << prim_id << "\n"
            << "  distance: " << ray.tmax << "\n"
            << "  barycentric coords.: " << u << ", " << v << std::endl;
        return 0;
    } else {
        std::cout << "No intersection found" << std::endl;
        return 1;
    }
}